

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

string * __thiscall
deqp::gles3::Functional::MultiVertexArrayStorageTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayStorageTests *this,Spec *spec)

{
  ostream *poVar1;
  Storage storage;
  long lVar2;
  long lVar3;
  string local_1d8;
  stringstream name;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&name);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  lVar2 = 8;
  for (lVar3 = 0;
      lVar3 < (int)((ulong)((long)(spec->arrays).
                                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(spec->arrays).
                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 6); lVar3 = lVar3 + 1
      ) {
    poVar1 = std::operator<<(&local_1a8,"_");
    deqp::gls::Array::storageToString_abi_cxx11_
              (&local_1d8,
               (Array *)(ulong)*(uint *)((long)&((spec->arrays).
                                                 super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                inputType + lVar2),storage);
    std::operator<<(poVar1,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    lVar2 = lVar2 + 0x40;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayStorageTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;
	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::storageToString(spec.arrays[arrayNdx].storage);
	}

	return name.str();
}